

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gme_File.cpp
# Opt level: O0

blargg_err_t __thiscall Gme_File::load_(Gme_File *this,Data_Reader *in)

{
  uchar *puVar1;
  size_t sVar2;
  long *in_RSI;
  long *in_RDI;
  blargg_err_t blargg_return_err__1;
  blargg_err_t blargg_return_err_;
  size_t in_stack_ffffffffffffffb0;
  blargg_vector<unsigned_char> *in_stack_ffffffffffffffb8;
  blargg_err_t local_8;
  
  (**(code **)(*in_RSI + 0x20))();
  local_8 = blargg_vector<unsigned_char>::resize
                      (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (local_8 == (blargg_err_t)0x0) {
    puVar1 = blargg_vector<unsigned_char>::begin((blargg_vector<unsigned_char> *)(in_RDI + 0x18));
    sVar2 = blargg_vector<unsigned_char>::size((blargg_vector<unsigned_char> *)(in_RDI + 0x18));
    local_8 = (blargg_err_t)(**(code **)(*in_RSI + 0x18))(in_RSI,puVar1,sVar2);
    if (local_8 == (blargg_err_t)0x0) {
      puVar1 = blargg_vector<unsigned_char>::begin((blargg_vector<unsigned_char> *)(in_RDI + 0x18));
      sVar2 = blargg_vector<unsigned_char>::size((blargg_vector<unsigned_char> *)(in_RDI + 0x18));
      local_8 = (blargg_err_t)(**(code **)(*in_RDI + 0x20))(in_RDI,puVar1,sVar2);
    }
  }
  return local_8;
}

Assistant:

blargg_err_t Gme_File::load_( Data_Reader& in )
{
	RETURN_ERR( file_data.resize( in.remain() ) );
	RETURN_ERR( in.read( file_data.begin(), (long)file_data.size() ) );
	return load_mem_( file_data.begin(), (long)file_data.size() );
}